

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_service.cpp
# Opt level: O2

bool __thiscall
booster::aio::event_loop_impl::run_one(event_loop_impl *this,event *evs,size_t evs_size)

{
  select_interrupter *this_00;
  deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
  *this_01;
  _Head_base<0UL,_booster::aio::reactor_*,_false> this_02;
  iterator __position;
  refcounted *prVar1;
  error_category *peVar2;
  bool bVar3;
  int iVar4;
  native_type nVar5;
  uint uVar6;
  callable<void_(const_std::error_code_&)> *r;
  recursive_mutex *this_03;
  size_type sVar7;
  long lVar8;
  error_category *peVar9;
  io_data *piVar10;
  system_error *this_04;
  uint uVar11;
  fd_set *in_RCX;
  int extraout_EDX;
  int extraout_EDX_00;
  uint uVar12;
  error_category *peVar13;
  uint uVar14;
  byte bVar15;
  fd_set *in_R8;
  completion_handler *__exceptfds;
  timeval *in_R9;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  ptime pVar19;
  error_code eVar20;
  recursive_mutex *local_c0;
  completion_handler exec;
  error_code select_error;
  lock_guard l;
  ptime local_40;
  
  local_c0 = &this->data_mutex_;
  this_03 = local_c0;
  std::unique_lock<std::recursive_mutex>::unique_lock(&l,local_c0);
  iVar4 = extraout_EDX;
  if ((this->reactor_)._M_t.
      super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>._M_t
      .super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>.
      super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl == (reactor *)0x0) {
    this_03 = (recursive_mutex *)operator_new(8);
    reactor::reactor((reactor *)this_03,this->reactor_type_);
    std::__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>::reset
              ((__uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                *)this,(pointer)this_03);
    iVar4 = extraout_EDX_00;
  }
  this_00 = &this->interrupter_;
  iVar4 = impl::select_interrupter::open(this_00,(char *)this_03,iVar4);
  if ((char)iVar4 != '\0') {
    this_02._M_head_impl =
         (this->reactor_)._M_t.
         super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>.
         _M_t.
         super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
         .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl;
    nVar5 = impl::select_interrupter::get_fd(this_00);
    reactor::select(this_02._M_head_impl,nVar5,(fd_set *)0x1,in_RCX,in_R8,in_R9);
  }
  this_01 = &this->dispatch_queue_;
  sVar7 = std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::size(this_01);
  for (; ((this->stop_ == false &&
          ((this->dispatch_queue_).
           super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
           (this->dispatch_queue_).
           super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur)) && (0 < (int)sVar7));
      sVar7 = (size_type)((int)sVar7 - 1)) {
    completion_handler::completion_handler(&exec);
    completion_handler::swap
              (&exec,(this->dispatch_queue_).
                     super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_cur);
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::pop_front(this_01);
    pthread_mutex_unlock((pthread_mutex_t *)local_c0);
    (*exec.type)(&exec);
    std::recursive_mutex::lock(local_c0);
    intrusive_ptr<booster::refcounted>::~intrusive_ptr(&exec.h);
  }
  pVar19 = ptime::now();
  local_40.sec = pVar19.sec;
  local_40.nsec = pVar19.nsec;
  while( true ) {
    bVar15 = this->stop_;
    if (((bool)bVar15 != false) ||
       ((this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0))
    goto LAB_00174de0;
    bVar3 = ptime::operator<=((ptime *)((this->timer_events_)._M_t._M_impl.super__Rb_tree_header.
                                        _M_header._M_left + 1),&local_40);
    if (!bVar3) break;
    __position._M_node = (this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    (this->timer_events_index_).
    super__Vector_base<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_booster::ptime,_booster::aio::event_loop_impl::timer_event>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start[*(int *)&__position._M_node[1]._M_left]._M_node =
         &(this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_header;
    exec.e._M_cat = (error_category *)std::_V2::system_category();
    exec.h.p_ = (refcounted *)__position._M_node[1]._M_right;
    __position._M_node[1]._M_right = (_Base_ptr)0x0;
    exec.e._0_8_ = exec.e._0_8_ & 0xffffffff00000000;
    exec.n = 0;
    exec.type = completion_handler::op_event_handler;
    std::
    deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
    ::push_back(this_01,&exec);
    std::
    _Rb_tree<booster::ptime,std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>,std::_Select1st<std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>>,std::less<booster::ptime>,std::allocator<std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>>>
    ::erase_abi_cxx11_((_Rb_tree<booster::ptime,std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>,std::_Select1st<std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>>,std::less<booster::ptime>,std::allocator<std::pair<booster::ptime_const,booster::aio::event_loop_impl::timer_event>>>
                        *)&this->timer_events_,__position);
    intrusive_ptr<booster::refcounted>::~intrusive_ptr(&exec.h);
  }
  bVar15 = this->stop_;
LAB_00174de0:
  if ((bVar15 & 1) == 0) {
    lVar17 = ptime::zero;
    iVar4 = DAT_001e0d18;
    if ((this->dispatch_queue_).
        super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->dispatch_queue_).
        super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      pVar19 = ptime::hours(1);
      lVar17 = pVar19.sec;
      iVar4 = pVar19.nsec;
    }
    if ((this->timer_events_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      pVar19 = ptime::operator-((ptime *)((this->timer_events_)._M_t._M_impl.super__Rb_tree_header.
                                          _M_header._M_left + 1),&local_40);
      lVar8 = pVar19.sec;
      if ((lVar8 < lVar17) || (pVar19.nsec < iVar4 && lVar8 <= lVar17)) {
        lVar17 = lVar8;
        iVar4 = pVar19.nsec;
      }
    }
    __exceptfds = &exec;
    exec.h.p_ = exec.h.p_ & 0xffffffff00000000;
    peVar9 = (error_category *)std::_V2::system_category();
    this->polling_ = true;
    exec.e._0_8_ = peVar9;
    pthread_mutex_unlock((pthread_mutex_t *)local_c0);
    uVar6 = reactor::poll((this->reactor_)._M_t.
                          super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                          .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                          (pollfd *)evs,evs_size & 0xffffffff,(int)lVar17 * 1000 + iVar4 / 1000000);
    std::recursive_mutex::lock(local_c0);
    this->polling_ = false;
    if ((((ulong)exec.h.p_ & 0xfffffffb) != 0) &&
       ((this->dispatch_queue_).
        super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        (this->dispatch_queue_).
        super__Deque_base<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur)) {
      this_04 = (system_error *)__cxa_allocate_exception(0x40);
      eVar20._0_8_ = (ulong)exec.h.p_ & 0xffffffff;
      eVar20._M_cat = (error_category *)exec.e._0_8_;
      system::system_error::system_error(this_04,eVar20);
      __cxa_throw(this_04,&system::system_error::typeinfo,system::system_error::~system_error);
    }
    uVar16 = evs_size & 0xffffffff;
    if ((int)uVar6 < (int)evs_size) {
      uVar16 = (ulong)uVar6;
    }
    randomize_events(this,evs,(int)uVar16);
    uVar18 = 0;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    for (; uVar16 != uVar18; uVar18 = uVar18 + 1) {
      iVar4 = evs[uVar18].fd;
      nVar5 = impl::select_interrupter::get_fd(this_00);
      if (iVar4 == nVar5) {
        impl::select_interrupter::clean(this_00);
      }
      else {
        piVar10 = socket_map<booster::aio::event_loop_impl::io_data>::operator[]
                            (&this->map_,evs[uVar18].fd);
        peVar2 = aio_error_cat;
        uVar6 = evs[uVar18].events;
        uVar11 = 0;
        uVar14 = uVar6 & 4;
        if (uVar14 == 0) {
          uVar11 = piVar10->current_event;
        }
        uVar12 = uVar11 & 0xfffffffe;
        if ((uVar6 & 1) == 0) {
          uVar12 = uVar11;
        }
        uVar11 = uVar12 & 0xfffffffd;
        if ((uVar6 & 2) == 0) {
          uVar11 = uVar12;
        }
        select_error._M_value = 0;
        select_error._M_cat = peVar9;
        reactor::select((this->reactor_)._M_t.
                        super___uniq_ptr_impl<booster::aio::reactor,_std::default_delete<booster::aio::reactor>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_booster::aio::reactor_*,_std::default_delete<booster::aio::reactor>_>
                        .super__Head_base<0UL,_booster::aio::reactor_*,_false>._M_head_impl,
                        evs[uVar18].fd,(fd_set *)(ulong)uVar11,(fd_set *)&select_error,
                        (fd_set *)__exceptfds,in_R9);
        uVar6 = uVar14 >> 1;
        peVar13 = peVar2;
        if (uVar14 == 0) {
          peVar13 = peVar9;
        }
        if ((select_error._M_value != 0) && (uVar11 = 0, peVar13 = peVar2, uVar14 == 0)) {
          local_c0 = (recursive_mutex *)(ulong)(uint)select_error._4_4_;
          peVar13 = select_error._M_cat;
          uVar6 = select_error._M_value;
        }
        piVar10->current_event = uVar11;
        if (((uVar11 & 1) == 0) &&
           (prVar1 = &((piVar10->readable).call_ptr.p_)->super_refcounted,
           prVar1 != (refcounted *)0x0)) {
          (piVar10->readable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
          exec.e._4_4_ = local_c0._0_4_;
          exec.e._M_value = uVar6;
          exec.n = 0;
          exec.type = completion_handler::op_event_handler;
          exec.h.p_ = prVar1;
          exec.e._M_cat = peVar13;
          std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::emplace_back<booster::aio::event_loop_impl::completion_handler>(this_01,&exec);
          intrusive_ptr<booster::refcounted>::~intrusive_ptr(&exec.h);
        }
        if (((uVar11 & 2) == 0) &&
           (prVar1 = &((piVar10->writeable).call_ptr.p_)->super_refcounted,
           prVar1 != (refcounted *)0x0)) {
          (piVar10->writeable).call_ptr.p_ = (callable<void_(const_std::error_code_&)> *)0x0;
          exec.e._4_4_ = local_c0._0_4_;
          exec.e._M_value = uVar6;
          exec.n = 0;
          exec.type = completion_handler::op_event_handler;
          exec.h.p_ = prVar1;
          exec.e._M_cat = peVar13;
          std::
          deque<booster::aio::event_loop_impl::completion_handler,_std::allocator<booster::aio::event_loop_impl::completion_handler>_>
          ::emplace_back<booster::aio::event_loop_impl::completion_handler>(this_01,&exec);
          intrusive_ptr<booster::refcounted>::~intrusive_ptr(&exec.h);
        }
      }
    }
    if (this->stop_ != false) {
      impl::select_interrupter::notify(this_00);
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&l);
  return (bool)(~bVar15 & 1);
}

Assistant:

bool run_one(reactor::event *evs,size_t evs_size)
	{
		lock_guard l(data_mutex_);
		if(!reactor_.get()) {
			reactor_.reset(new reactor(reactor_type_));
		}
		if(interrupter_.open()) {
			reactor_->select(interrupter_.get_fd(),reactor::in);
		}

		int counter = dispatch_queue_.size();
		while(!stop_ && !dispatch_queue_.empty() && counter > 0) {
			completion_handler exec;
			exec.swap(dispatch_queue_.front());
			dispatch_queue_.pop_front();
			
			data_mutex_.unlock();
			try {
				
				exec();
			}
			catch(...) {
				data_mutex_.lock();
				throw;
			}
			data_mutex_.lock();
			counter --;
		}

		ptime now = ptime::now();

		while(!stop_ && !timer_events_.empty() && timer_events_.begin()->first <= now) {
			timer_events_type::iterator evptr = timer_events_.begin();
			timer_events_index_[evptr->second.event_id] = timer_events_.end();
			completion_handler disp(evptr->second.h,system::error_code());
			dispatch_queue_.push_back(disp);
			timer_events_.erase(evptr);
		}


		//
		// Restart -- dispatch timed-out timers, we also need to read now - once again
		//

		if(stop_)
			return false;

		ptime wait_time = dispatch_queue_.empty() ? ptime::hours(1) : ptime::zero;

		if(!timer_events_.empty()) {
			ptime diff = timer_events_.begin()->first - now;
			if(diff < wait_time)
				wait_time = diff;
			assert(wait_time >= ptime::zero);
		}

		
		int n = 0;

		{
			system::error_code poll_error;
			polling_ = true;
			try {
				data_mutex_.unlock();
				n = reactor_->poll(evs,evs_size,int(ptime::milliseconds(wait_time)),poll_error);
			}
			catch(...) {
				data_mutex_.lock();
				polling_ = false;
				throw;
			}
			data_mutex_.lock();
			polling_ = false;
		
			//
			// We may get EBADF, so if we do not handle it we may loop
			// forever. However, maybe there is a handler that handles this
			// in dipatch queue (for example close was executed).
			// So let's try again
			//
			// But if it empty - no handlers, abort.
			//
			if(poll_error && poll_error.value()!=EINTR && dispatch_queue_.empty()) {
				throw system::system_error(poll_error);
			}

		}

		if( n > int(evs_size) )
			n=evs_size;
		randomize_events(evs,n);
		for(int i=0;i<n && i<int(evs_size);i++) {
			
			if(evs[i].fd == interrupter_.get_fd()) {
				interrupter_.clean();
				continue;
			}
			
			using booster::system::error_code;

			io_data &cont = map_[evs[i].fd];
			
			int new_events = cont.current_event;

			error_code dispatch_error;

			if(evs[i].events & reactor::err) {
				dispatch_error = error_code(aio_error::select_failed,aio_error_cat);
				new_events = 0;
			}
			if(evs[i].events & reactor::in)
				new_events &= ~reactor::in;
			if(evs[i].events & reactor::out)
				new_events &= ~reactor::out;
			
			error_code select_error;
			reactor_->select(evs[i].fd,new_events,select_error);
			if(select_error) {
				new_events = 0;
				if(!dispatch_error)
					dispatch_error=select_error;
			}
			
			cont.current_event = new_events;

			if(cont.readable && (new_events & reactor::in) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.readable,dispatch_error));
			}
			if(cont.writeable && (new_events & reactor::out) == 0) {
				dispatch_queue_.push_back(completion_handler(cont.writeable,dispatch_error));
			}
			
			if(new_events == 0)
				map_.erase(evs[i].fd);
		}

		if(stop_) {
			wake();
		}

		return true;

	}